

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sequence.cc
# Opt level: O0

void __thiscall
Sequence::insert_freqarray(Sequence *this,shared_ptr<Lists<std::shared_ptr<Eqclass>_>_> *LargeL)

{
  bool bVar1;
  uint uVar2;
  element_type *this_00;
  shared_ptr<Eqclass> *psVar3;
  element_type *peVar4;
  __shared_ptr_access<Lists<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *p_Var5;
  element_type *peVar6;
  shared_ptr<Itemset> *psVar7;
  undefined1 local_c8 [32];
  undefined1 local_a8 [32];
  undefined1 local_88 [32];
  undefined1 local_68 [16];
  undefined1 local_58 [8];
  Eqclass_S cluster;
  shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> hdr2;
  shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> hdr1;
  shared_ptr<ListNodes<std::shared_ptr<Eqclass>_>_> chd;
  shared_ptr<Lists<std::shared_ptr<Eqclass>_>_> *LargeL_local;
  Sequence *this_local;
  
  std::shared_ptr<ListNodes<std::shared_ptr<Eqclass>_>_>::shared_ptr
            ((shared_ptr<ListNodes<std::shared_ptr<Eqclass>_>_> *)
             &hdr1.
              super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_>::shared_ptr
            ((shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> *)
             &hdr2.
              super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_>::shared_ptr
            ((shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> *)
             &cluster.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<Eqclass>::shared_ptr((shared_ptr<Eqclass> *)local_58);
  std::
  __shared_ptr_access<Lists<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<Lists<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)LargeL);
  Lists<std::shared_ptr<Eqclass>_>::head((Lists<std::shared_ptr<Eqclass>_> *)local_68);
  std::shared_ptr<ListNodes<std::shared_ptr<Eqclass>_>_>::operator=
            ((shared_ptr<ListNodes<std::shared_ptr<Eqclass>_>_> *)
             &hdr1.
              super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(shared_ptr<ListNodes<std::shared_ptr<Eqclass>_>_> *)local_68);
  std::shared_ptr<ListNodes<std::shared_ptr<Eqclass>_>_>::~shared_ptr
            ((shared_ptr<ListNodes<std::shared_ptr<Eqclass>_>_> *)local_68);
  while( true ) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool
                      ((__shared_ptr *)
                       &hdr1.
                        super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount);
    if (!bVar1) break;
    this_00 = std::
              __shared_ptr_access<ListNodes<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<ListNodes<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&hdr1.
                               super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                               ._M_refcount);
    psVar3 = ListNodes<std::shared_ptr<Eqclass>_>::item(this_00);
    std::shared_ptr<Eqclass>::operator=((shared_ptr<Eqclass> *)local_58,psVar3);
    peVar4 = std::__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_58);
    p_Var5 = (__shared_ptr_access<Lists<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)Eqclass::list(peVar4);
    std::
    __shared_ptr_access<Lists<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->(p_Var5);
    Lists<std::shared_ptr<Itemset>_>::head((Lists<std::shared_ptr<Itemset>_> *)local_88);
    std::shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_>::operator=
              ((shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> *)
               &hdr2.
                super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,(shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> *)local_88);
    std::shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_>::~shared_ptr
              ((shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> *)local_88);
    while( true ) {
      bVar1 = std::__shared_ptr::operator_cast_to_bool
                        ((__shared_ptr *)
                         &hdr2.
                          super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount);
      if (!bVar1) break;
      peVar6 = std::
               __shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&hdr2.
                                super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount);
      psVar7 = ListNodes<std::shared_ptr<Itemset>_>::item(peVar6);
      peVar4 = std::__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          local_58);
      uVar2 = Eqclass::templ(peVar4);
      add_freq(this,psVar7,uVar2);
      std::
      __shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)&hdr2.
                       super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount);
      ListNodes<std::shared_ptr<Itemset>_>::next
                ((ListNodes<std::shared_ptr<Itemset>_> *)(local_a8 + 0x10));
      std::shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_>::operator=
                ((shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> *)
                 &hdr2.
                  super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,
                 (shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> *)(local_a8 + 0x10));
      std::shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_>::~shared_ptr
                ((shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> *)(local_a8 + 0x10));
    }
    peVar4 = std::__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_58);
    p_Var5 = (__shared_ptr_access<Lists<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)Eqclass::list2(peVar4);
    std::
    __shared_ptr_access<Lists<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->(p_Var5);
    Lists<std::shared_ptr<Itemset>_>::head((Lists<std::shared_ptr<Itemset>_> *)local_a8);
    std::shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_>::operator=
              ((shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> *)
               &cluster.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> *)local_a8);
    std::shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_>::~shared_ptr
              ((shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> *)local_a8);
    while( true ) {
      bVar1 = std::__shared_ptr::operator_cast_to_bool
                        ((__shared_ptr *)
                         &cluster.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
      if (!bVar1) break;
      peVar6 = std::
               __shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&cluster.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
      psVar7 = ListNodes<std::shared_ptr<Itemset>_>::item(peVar6);
      peVar4 = std::__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Eqclass,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          local_58);
      uVar2 = Eqclass::templ2(peVar4);
      add_freq(this,psVar7,uVar2);
      std::
      __shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)&cluster.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      ListNodes<std::shared_ptr<Itemset>_>::next
                ((ListNodes<std::shared_ptr<Itemset>_> *)(local_c8 + 0x10));
      std::shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_>::operator=
                ((shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> *)
                 &cluster.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> *)(local_c8 + 0x10));
      std::shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_>::~shared_ptr
                ((shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> *)(local_c8 + 0x10));
    }
    std::
    __shared_ptr_access<ListNodes<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<ListNodes<std::shared_ptr<Eqclass>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)&hdr1.
                     super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount);
    ListNodes<std::shared_ptr<Eqclass>_>::next((ListNodes<std::shared_ptr<Eqclass>_> *)local_c8);
    std::shared_ptr<ListNodes<std::shared_ptr<Eqclass>_>_>::operator=
              ((shared_ptr<ListNodes<std::shared_ptr<Eqclass>_>_> *)
               &hdr1.
                super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,(shared_ptr<ListNodes<std::shared_ptr<Eqclass>_>_> *)local_c8);
    std::shared_ptr<ListNodes<std::shared_ptr<Eqclass>_>_>::~shared_ptr
              ((shared_ptr<ListNodes<std::shared_ptr<Eqclass>_>_> *)local_c8);
  }
  std::shared_ptr<Eqclass>::~shared_ptr((shared_ptr<Eqclass> *)local_58);
  std::shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_>::~shared_ptr
            ((shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> *)
             &cluster.super___shared_ptr<Eqclass,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_>::~shared_ptr
            ((shared_ptr<ListNodes<std::shared_ptr<Itemset>_>_> *)
             &hdr2.
              super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::shared_ptr<ListNodes<std::shared_ptr<Eqclass>_>_>::~shared_ptr
            ((shared_ptr<ListNodes<std::shared_ptr<Eqclass>_>_> *)
             &hdr1.
              super___shared_ptr<ListNodes<std::shared_ptr<Itemset>_>,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void Sequence::insert_freqarray(shared_ptr<Lists<Eqclass_S>>& LargeL) {
    //insert frequent itemsets into hash table
    shared_ptr<ListNodes<Eqclass_S>> chd;
    shared_ptr<ListNodes<shared_ptr<Itemset>>> hdr1, hdr2;
    Eqclass_S cluster;

    chd = LargeL->head();
    for (; chd; chd = chd->next()) {
        cluster = chd->item();
        hdr1 = cluster->list()->head();
        for (; hdr1; hdr1 = hdr1->next()) {
            add_freq(hdr1->item(), cluster->templ());
            //hdr1->item()->print_seq(seqstrm, cluster->templ());
        }
        hdr2 = cluster->list2()->head();
        for (; hdr2; hdr2 = hdr2->next()) {
            add_freq(hdr2->item(), cluster->templ2());
            //hdr2->item()->print_seq(seqstrm, cluster->templ2());
        }
    }
}